

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfectorHelpers.hpp
# Opt level: O0

void __thiscall
Infector::AnyShared<concreteA,_IA>::resolve_multiple_cast<IA>
          (AnyShared<concreteA,_IA> *this,concreteA *tp)

{
  mapped_type *ppvVar1;
  mapped_type local_30;
  type_index local_28;
  mapped_type local_20;
  IA *base;
  concreteA *tp_local;
  AnyShared<concreteA,_IA> *this_local;
  
  local_30 = (mapped_type)0x0;
  if (tp != (concreteA *)0x0) {
    local_30 = &tp->field_0x0 + *(long *)((long)*tp + -0x28);
  }
  local_20 = local_30;
  base = (IA *)tp;
  tp_local = (concreteA *)this;
  std::type_index::type_index(&local_28,(type_info *)&IA::typeinfo);
  ppvVar1 = std::
            unordered_map<std::type_index,_void_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_void_*>_>_>
            ::operator[](&this->multi_solver,&local_28);
  *ppvVar1 = local_30;
  return;
}

Assistant:

void resolve_multiple_cast(T*tp){
            Base1* base = tp;
            multi_solver[std::type_index(typeid(Base1))]
                          = reinterpret_cast<void*>(base);
        }